

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlcdnumber.cpp
# Opt level: O3

void QLCDNumber::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint *puVar1;
  long lVar2;
  double *pdVar3;
  byte bVar4;
  uint uVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      return;
    case 1:
      display((QLCDNumber *)_o,(QString *)_a[1]);
      return;
    case 2:
      pdVar3 = (double *)_a[1];
switchD_00416c94_caseD_5:
      display((QLCDNumber *)_o,*(int *)pdVar3);
      return;
    case 3:
      pdVar3 = (double *)_a[1];
switchD_00416c94_caseD_4:
      display((QLCDNumber *)_o,*pdVar3);
      return;
    case 4:
      lVar2 = *(long *)(_o + 8);
      *(byte *)(lVar2 + 0x288) = *(byte *)(lVar2 + 0x288) & 0xfc;
      goto LAB_00416e28;
    case 5:
      lVar2 = *(long *)(_o + 8);
      bVar4 = (*(byte *)(lVar2 + 0x288) & 0xfc) + 1;
      break;
    case 6:
      lVar2 = *(long *)(_o + 8);
      bVar4 = *(byte *)(lVar2 + 0x288) & 0xfc | 2;
      break;
    case 7:
      lVar2 = *(long *)(_o + 8);
      *(byte *)(lVar2 + 0x288) = *(byte *)(lVar2 + 0x288) | 3;
      goto LAB_00416e28;
    case 8:
      pdVar3 = (double *)_a[1];
switchD_00416c94_caseD_0:
      *(byte *)(*(long *)(_o + 8) + 0x288) =
           *(byte *)(*(long *)(_o + 8) + 0x288) & 0xfb | *(char *)pdVar3 << 2;
      QWidget::update((QWidget *)_o);
      return;
    default:
      goto switchD_00416c51_caseD_3;
    }
    *(byte *)(lVar2 + 0x288) = bVar4;
LAB_00416e28:
    display((QLCDNumber *)_o,*(double *)(lVar2 + 0x280));
    return;
  case ReadProperty:
    if ((uint)_id < 6) {
      puVar1 = (uint *)*_a;
      switch(_id) {
      case 0:
        *(byte *)puVar1 = *(byte *)(*(long *)(_o + 8) + 0x288) >> 2 & 1;
        return;
      case 1:
        uVar5 = *(uint *)(*(long *)(_o + 8) + 0x278);
        break;
      case 2:
        uVar5 = *(byte *)(*(long *)(_o + 8) + 0x288) & 3;
        break;
      case 3:
        bVar4 = *(byte *)(*(long *)(_o + 8) + 0x288) & 0x18;
        uVar5 = 0;
        if (bVar4 != 0x10) {
          uVar5 = (bVar4 != 0x18) + 1;
        }
        *puVar1 = uVar5;
        return;
      case 4:
        *(undefined8 *)puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x280);
        return;
      case 5:
        uVar5 = (uint)((double)((ulong)*(double *)(*(long *)(_o + 8) + 0x280) & 0x8000000000000000 |
                               (ulong)DAT_006605c0) + *(double *)(*(long *)(_o + 8) + 0x280));
      }
      *puVar1 = uVar5;
      return;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      pdVar3 = (double *)*_a;
      switch(_id) {
      case 0:
        goto switchD_00416c94_caseD_0;
      case 1:
        setDigitCount((QLCDNumber *)_o,*(int *)pdVar3);
        return;
      case 2:
        lVar2 = *(long *)(_o + 8);
        *(byte *)(lVar2 + 0x288) = *(byte *)(lVar2 + 0x288) & 0xfc | *(byte *)pdVar3 & 3;
        display((QLCDNumber *)_o,*(double *)(lVar2 + 0x280));
        return;
      case 3:
        *(byte *)(*(long *)(_o + 8) + 0x288) =
             (*(uint *)pdVar3 < 2) << 4 | (*(uint *)pdVar3 - 1 < 2) << 3 |
             *(byte *)(*(long *)(_o + 8) + 0x288) & 0xe7;
        QWidget::update((QWidget *)_o);
        return;
      case 4:
        goto switchD_00416c94_caseD_4;
      }
      goto switchD_00416c94_caseD_5;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == overflow) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
switchD_00416c51_caseD_3:
  return;
}

Assistant:

void QLCDNumber::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLCDNumber *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->overflow(); break;
        case 1: _t->display((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->display((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->display((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 4: _t->setHexMode(); break;
        case 5: _t->setDecMode(); break;
        case 6: _t->setOctMode(); break;
        case 7: _t->setBinMode(); break;
        case 8: _t->setSmallDecimalPoint((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLCDNumber::*)()>(_a, &QLCDNumber::overflow, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->smallDecimalPoint(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->digitCount(); break;
        case 2: *reinterpret_cast<Mode*>(_v) = _t->mode(); break;
        case 3: *reinterpret_cast<SegmentStyle*>(_v) = _t->segmentStyle(); break;
        case 4: *reinterpret_cast<double*>(_v) = _t->value(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->intValue(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSmallDecimalPoint(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setDigitCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMode(*reinterpret_cast<Mode*>(_v)); break;
        case 3: _t->setSegmentStyle(*reinterpret_cast<SegmentStyle*>(_v)); break;
        case 4: _t->display(*reinterpret_cast<double*>(_v)); break;
        case 5: _t->display(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}